

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O1

Maybe<capnp::InterfaceSchema> __thiscall
capnp::InterfaceSchema::findSuperclass(InterfaceSchema *this,uint64_t typeId,uint *counter)

{
  uint uVar1;
  uint *in_RCX;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::InterfaceSchema>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::InterfaceSchema>_2 extraout_RDX_00;
  ulong uVar3;
  uint64_t id;
  ulong uVar4;
  Maybe<capnp::InterfaceSchema> MVar5;
  Reader superclass;
  Reader superclasses;
  Schema local_c8;
  Schema local_c0;
  StructReader local_b8;
  PointerReader local_88;
  ListReader local_68;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::InterfaceSchema>_2 aVar2;
  
  uVar1 = *in_RCX;
  *in_RCX = uVar1 + 1;
  if (uVar1 < 0x40) {
    if (*(uint **)**(long **)typeId == counter) {
      *(undefined1 *)&(this->super_Schema).raw = 1;
      local_88.capTable = *(CapTableReader **)typeId;
      aVar2 = (anon_union_8_1_a8c68091_for_NullableValue<capnp::InterfaceSchema>_2)counter;
LAB_003fb0fb:
      this[1].super_Schema.raw = (RawBrandedSchema *)local_88.capTable;
    }
    else {
      local_68.ptr = *(byte **)(**(long **)typeId + 8);
      local_68.segment = (SegmentReader *)0x0;
      local_68.capTable = (CapTableReader *)0x0;
      local_68.elementCount = 0x7fffffff;
      capnp::_::PointerReader::getStruct(&local_b8,(PointerReader *)&local_68,(word *)0x0);
      local_88.pointer = (WirePointer *)0x0;
      local_88.segment = (SegmentReader *)0x0;
      local_88.capTable = (CapTableReader *)(RawBrandedSchema *)0x0;
      local_88.nestingLimit = 0x7fffffff;
      if (4 < local_b8.pointerCount) {
        local_88.pointer = local_b8.pointers + 4;
        local_88.segment = local_b8.segment;
        local_88.capTable = local_b8.capTable;
        local_88.nestingLimit = local_b8.nestingLimit;
      }
      capnp::_::PointerReader::getList(&local_68,&local_88,INLINE_COMPOSITE,(word *)0x0);
      uVar3 = (ulong)local_68.elementCount;
      aVar2 = extraout_RDX;
      if (uVar3 != 0) {
        uVar4 = 0;
        do {
          capnp::_::ListReader::getStructElement(&local_b8,&local_68,(ElementCount)uVar4);
          if (local_b8.dataSize < 0x40) {
            id = 0;
          }
          else {
            id = *local_b8.data;
          }
          local_c8 = Schema::getDependency((Schema *)typeId,id,(ElementCount)uVar4 | 0x4000000);
          local_c0.raw = (RawBrandedSchema *)Schema::asInterface(&local_c8);
          MVar5 = findSuperclass((InterfaceSchema *)&local_88,(uint64_t)&local_c0,counter);
          aVar2 = MVar5.ptr.field_1;
          if ((char)local_88.segment == '\x01') {
            *(undefined1 *)&(this->super_Schema).raw = 1;
            goto LAB_003fb0fb;
          }
          uVar4 = uVar4 + 1;
        } while (uVar3 != uVar4);
      }
      *(undefined1 *)&(this->super_Schema).raw = 0;
    }
  }
  else {
    findSuperclass();
    aVar2 = extraout_RDX_00;
  }
  MVar5.ptr.field_1 = aVar2;
  MVar5.ptr._0_8_ = this;
  return (Maybe<capnp::InterfaceSchema>)MVar5.ptr;
}

Assistant:

kj::Maybe<InterfaceSchema> InterfaceSchema::findSuperclass(uint64_t typeId, uint& counter) const {
  // Security:  Don't let someone DOS us with a dynamic schema containing cyclic inheritance.
  KJ_REQUIRE(counter++ < MAX_SUPERCLASSES, "Cyclic or absurdly-large inheritance graph detected.") {
    return nullptr;
  }

  if (typeId == raw->generic->id) {
    return *this;
  }

  // TODO(perf):  This may be somewhat slow.  See findMethodByName() for discussion.
  auto superclasses = getProto().getInterface().getSuperclasses();
  for (auto i: kj::indices(superclasses)) {
    auto superclass = superclasses[i];
    uint location = _::RawBrandedSchema::makeDepLocation(
        _::RawBrandedSchema::DepKind::SUPERCLASS, i);
    KJ_IF_MAYBE(result, getDependency(superclass.getId(), location).asInterface()
                            .findSuperclass(typeId, counter)) {
      return *result;
    }
  }

  return nullptr;
}